

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O2

void dfft_redistribute_cyclic_to_block_1d
               (int *dim,int *pdim,int ndim,int current_dim,int c0,int c1,int *pidx,int rev,
               int size_in,int *embed,cpx_t *work,cpx_t *scratch,int *rho_L,int *rho_pk0,
               int *dfft_nsend,int *dfft_nrecv,int *dfft_offset_send,int *dfft_offset_recv,
               MPI_Comm comm,int *proc_map,int row_m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  float *pfVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  cpx_t *pcVar15;
  int k;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  cpx_t *local_48;
  
  if (c1 != c0) {
    iVar18 = pdim[current_dim];
    iVar1 = dim[current_dim] / iVar18;
    iVar2 = iVar1 * c1;
    uVar29 = iVar2 / c0 + (uint)(iVar2 / c0 == 0);
    iVar5 = embed[current_dim];
    iVar25 = pidx[current_dim];
    iVar3 = iVar25 / c1;
    uVar14 = 0;
    uVar7 = 0;
    if (0 < ndim) {
      uVar7 = (ulong)(uint)ndim;
    }
    local_48 = scratch;
    uVar24 = 1;
    for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
      uVar24 = uVar24 * pdim[uVar14];
    }
    uVar14 = (long)size_in / (long)iVar5 & 0xffffffff;
    uVar21 = 0;
    uVar26 = (ulong)uVar24;
    if ((int)uVar24 < 1) {
      uVar26 = 0;
    }
    for (; uVar26 != uVar21; uVar21 = uVar21 + 1) {
      dfft_nsend[uVar21] = 0;
      dfft_nrecv[uVar21] = 0;
      dfft_offset_send[uVar21] = 0;
      dfft_offset_recv[uVar21] = 0;
    }
    iVar4 = (int)((long)size_in / (long)iVar5);
    uVar24 = iVar4 * uVar29;
    iVar5 = 0;
    if (0 < iVar18) {
      iVar5 = iVar18;
    }
    uVar21 = (ulong)(uint)current_dim;
    iVar11 = 0;
    for (iVar27 = 0; iVar27 != iVar5; iVar27 = iVar27 + 1) {
      iVar12 = iVar27 % c0;
      uVar26 = (long)iVar27 / (long)c1 & 0xffffffff;
      uVar13 = (int)((long)iVar27 / (long)c1) >> 0x1f;
      if (c0 <= iVar1 && rev != 0) {
        uVar16 = (uint)((int)((long)((ulong)uVar13 << 0x20 | uVar26) % (long)(iVar18 / c0)) ==
                       rho_pk0[iVar25 / c0]);
        uVar17 = (uint)(iVar3 % (iVar18 / c0) == rho_pk0[iVar27 / c0]);
        if (iVar2 < c0) goto LAB_00102281;
LAB_00102298:
        iVar6 = ((int)((long)((ulong)uVar13 << 0x20 | uVar26) % (long)(c0 / c1)) * iVar2) / c0;
      }
      else {
        uVar17 = 0;
        uVar16 = 0;
        if ((int)((long)((ulong)uVar13 << 0x20 | uVar26) / (long)(c0 / c1)) == iVar25 / c0) {
          uVar16 = (uint)((iVar25 % c0) % c1 == iVar27 % c1);
        }
        if (iVar3 / (c0 / c1) == iVar27 / c0) {
          uVar17 = (uint)(iVar12 % c1 == iVar25 % c1);
        }
        if (c0 <= iVar2) goto LAB_00102298;
        if ((iVar25 % c0) / iVar2 !=
            (int)((long)((ulong)uVar13 << 0x20 | uVar26) % (long)(c0 / iVar2))) {
          uVar16 = 0;
        }
        if (iVar12 / iVar2 != iVar3 % (c0 / iVar2)) {
          uVar17 = 0;
        }
LAB_00102281:
        uVar28 = (long)((ulong)uVar13 << 0x20 | uVar26) / (long)(c0 / iVar2);
        iVar6 = (int)((long)((ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) %
                     (long)iVar1);
      }
      if (rev != 0) {
        if (iVar1 < c0) {
          iVar6 = rho_L[iVar6];
        }
        else {
          iVar6 = (int)((long)((ulong)uVar13 << 0x20 | uVar26) / (long)(iVar18 / c0));
        }
      }
      if (uVar17 != 0) {
        uVar17 = uVar24;
      }
      if (row_m == 0) {
        iVar9 = 0;
        for (uVar26 = 0; uVar7 != uVar26; uVar26 = uVar26 + 1) {
          iVar20 = iVar27;
          if (uVar21 != uVar26) {
            iVar20 = pidx[uVar26];
          }
          iVar9 = iVar9 * pdim[uVar26] + iVar20;
        }
      }
      else {
        iVar9 = 0;
        for (uVar26 = (ulong)(uint)ndim; 0 < (int)uVar26; uVar26 = uVar26 - 1) {
          iVar20 = iVar27;
          if (uVar21 + 1 != uVar26) {
            iVar20 = pidx[uVar26 - 1];
          }
          iVar9 = iVar9 * pdim[uVar26 - 1] + iVar20;
        }
      }
      iVar6 = iVar6 * iVar4 * 8;
      if (uVar16 == 0) {
        iVar6 = 0;
      }
      iVar9 = proc_map[iVar9];
      dfft_offset_send[iVar9] = iVar6;
      iVar6 = iVar11;
      if ((rev != 0) && (c0 / c1 < iVar1)) {
        iVar6 = (iVar12 * iVar4 * iVar1) / c0;
      }
      dfft_offset_recv[iVar9] = iVar6 << 3;
      if (uVar16 != 0) {
        uVar16 = uVar24 * 8;
      }
      dfft_nsend[iVar9] = uVar16;
      dfft_nrecv[iVar9] = uVar17 * 8;
      iVar11 = iVar11 + uVar17;
    }
    if ((rev == 0) || ((int)uVar24 <= iVar4)) {
      uVar7 = (long)iVar1 / (long)(int)uVar29;
      MPI_Barrier(comm,pdim,(long)iVar1 % (long)(int)uVar29 & 0xffffffff);
      MPI_Alltoallv(work,dfft_nsend,dfft_offset_send,&ompi_mpi_byte,scratch,dfft_nrecv,
                    dfft_offset_recv,&ompi_mpi_byte,comm);
      uVar26 = 0;
      uVar21 = 0;
      if (0 < iVar4) {
        uVar21 = uVar14;
      }
      uVar14 = (ulong)uVar29;
      if ((int)uVar29 < 1) {
        uVar14 = uVar26;
      }
      uVar28 = uVar7 & 0xffffffff;
      if ((int)uVar7 < 1) {
        uVar28 = uVar26;
      }
      lVar23 = (long)iVar4 * 8;
      for (; uVar26 != uVar28; uVar26 = uVar26 + 1) {
        iVar18 = (int)uVar26 * c1 + iVar25 % c1;
        if (c0 <= iVar1 && rev != 0) {
          iVar18 = (iVar18 * iVar1) / c0;
          lVar8 = 1;
        }
        else {
          iVar18 = iVar18 / c1;
          lVar8 = (long)(c0 / c1);
        }
        pfVar10 = (float *)((long)&work->x + iVar18 * lVar23);
        pcVar15 = local_48;
        for (uVar7 = 0; uVar7 != uVar14; uVar7 = uVar7 + 1) {
          for (uVar19 = 0; uVar21 != uVar19; uVar19 = uVar19 + 1) {
            *(cpx_t *)(pfVar10 + uVar19 * 2) = pcVar15[uVar19];
          }
          pfVar10 = (float *)((long)pfVar10 + lVar8 * lVar23);
          pcVar15 = pcVar15 + iVar4;
        }
        local_48 = local_48 + (int)uVar24;
      }
    }
    else {
      uVar26 = 0;
      if (iVar4 < 1) {
        uVar14 = uVar26;
      }
      uVar28 = (ulong)iVar4;
      iVar18 = 0;
      while (iVar25 = (int)uVar26, iVar25 != iVar5) {
        if (row_m == 0) {
          iVar1 = 0;
          for (uVar26 = 0; uVar7 != uVar26; uVar26 = uVar26 + 1) {
            iVar2 = iVar25;
            if (uVar21 != uVar26) {
              iVar2 = pidx[uVar26];
            }
            iVar1 = iVar1 * pdim[uVar26] + iVar2;
          }
        }
        else {
          iVar1 = 0;
          for (uVar26 = (ulong)(uint)ndim; 0 < (int)uVar26; uVar26 = uVar26 - 1) {
            iVar2 = iVar25;
            if (uVar21 + 1 != uVar26) {
              iVar2 = pidx[uVar26 - 1];
            }
            iVar1 = iVar1 * pdim[uVar26 - 1] + iVar2;
          }
        }
        iVar1 = proc_map[iVar1];
        iVar2 = dfft_offset_send[iVar1];
        dfft_offset_send[iVar1] = iVar4 * 8 * iVar18;
        uVar29 = dfft_nsend[iVar1] / iVar4 >> 3;
        uVar26 = 0;
        if (0 < (int)uVar29) {
          uVar26 = (ulong)uVar29;
        }
        pfVar10 = (float *)((long)&scratch->x + (long)iVar18 * uVar28 * 8);
        for (uVar19 = 0; uVar19 != uVar26; uVar19 = uVar19 + 1) {
          for (uVar22 = 0; uVar14 != uVar22; uVar22 = uVar22 + 1) {
            *(cpx_t *)(pfVar10 + uVar22 * 2) =
                 work[(uVar19 * (long)c0 + (long)(int)(((ulong)(long)iVar2 >> 3) / uVar28)) * uVar28
                      + uVar22];
          }
          pfVar10 = pfVar10 + uVar28 * 2;
        }
        iVar18 = iVar18 + uVar29;
        uVar26 = (ulong)(iVar25 + 1);
      }
      MPI_Barrier(comm);
      MPI_Alltoallv(scratch,dfft_nsend,dfft_offset_send,&ompi_mpi_byte,work,dfft_nrecv,
                    dfft_offset_recv,&ompi_mpi_byte,comm);
    }
  }
  return;
}

Assistant:

void dfft_redistribute_cyclic_to_block_1d(int *dim,
                     int *pdim,
                     int ndim,
                     int current_dim,
                     int c0,
                     int c1,
                     int* pidx,
                     int rev,
                     int size_in,
                     int *embed,
                     cpx_t *work,
                     cpx_t *scratch,
                     int *rho_L,
                     int *rho_pk0,
                     int *dfft_nsend,
                     int *dfft_nrecv,
                     int *dfft_offset_send,
                     int *dfft_offset_recv,
                     MPI_Comm comm,
                     int *proc_map,
                     int row_m)
    {
    if (c1 == c0) return;

    /* length along current dimension */
    int length = dim[current_dim]/pdim[current_dim];
    int size = length*c1/c0;
    size = (size ? size : 1);
    int npackets = length/size;

    int stride = size_in/embed[current_dim];

    /* processor index along current dimension */
    int s=pidx[current_dim];
    /* number of procs along current dimension */
    int p=pdim[current_dim];

    size *= stride;

    int offset = 0;
    int recv_size,send_size;
    int j0_local = s%c0;
    int j2_local = s/c0;
    int j0_new_local = s%c1;
    int j2_new_local = s/c1;

    int pdim_tot=1;
    int k;
    for (k = 0; k < ndim; ++k)
        pdim_tot *= pdim[k];

    int i;
    for (i = 0; i < pdim_tot; ++i)
        {
        dfft_nsend[i] = 0;
        dfft_nrecv[i] = 0;
        dfft_offset_send[i] = 0;
        dfft_offset_recv[i] = 0;
        }

    for (i = 0; i < p; ++i)
        {
        int j0_remote = i%c0;
        int j2_remote = i/c0;

        int j0_new_remote = i % c1;
        int j2_new_remote = i/c1;

        /* decision to send and/or receive */
        int send = 0;
        int recv = 0;
        if (rev && (length >= c0))
            {
            /* redistribute into block with reversed processor id
               and swapped-partially reversed local order (the c0 LSB
               of the local index are MSB, and the n/p/c0 MSB
               are LSB and are reversed */
            send = (((j2_new_remote % (p/c0)) == (rho_pk0[j2_local])) ? 1 : 0);
            recv = (((j2_new_local % (p/c0)) == (rho_pk0[j2_remote])) ? 1 : 0);
            }
        else
            {
            send = (((j2_new_remote / (c0/c1)) == j2_local) && ((j0_local % c1)==j0_new_remote) ? 1 : 0); 
            recv = (((j2_new_local / (c0/c1)) == j2_remote) &&  ((j0_remote % c1)==j0_new_local) ? 1 : 0);

            if (length*c1 < c0)
                {
                send &= (j0_local/(length*c1) == j2_new_remote % (c0/(length*c1)));
                recv &= (j0_remote/(length*c1) == j2_new_local % (c0/(length*c1)));
                }
            }

        /* offset of first element sent */
        int j1;
        if (length*c1 >= c0)
            {
            j1 = (j2_new_remote % (c0/c1))*length*c1/c0;
            }
        else
            {
            j1 = (j2_new_remote / (c0/(length*c1))) % length;
            }

        if (rev)
            {
            if (length >= c0)
                {
                j1 = j2_new_remote/(p/c0);
                }
            else
                j1 = rho_L[j1];
            }

        /* mirror remote decision to send */
        send_size = (send ? size : 0);
        recv_size = (recv ? size : 0);

        int destproc = 0;
        int k;
        if (row_m)
            {
            for (k = ndim-1; k >=0 ;--k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? i : pidx[k]);
                }
            }
        else
            {
            for (k = 0; k < ndim; ++k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? i : pidx[k]);
                }
            }

        int rank = proc_map[destproc];

        dfft_offset_send[rank] = (send ? (stride*j1*sizeof(cpx_t)) : 0);
        if (rev && (length > c0/c1))
            {
            /* we are directly receving into the work buf */
            dfft_offset_recv[rank] = stride*j0_remote*length/c0*sizeof(cpx_t);
            }
        else
            {
            dfft_offset_recv[rank] = offset*sizeof(cpx_t);
            }

        dfft_nsend[rank] = send_size*sizeof(cpx_t);
        dfft_nrecv[rank] = recv_size*sizeof(cpx_t);
        offset += (recv ? size : 0);
        }

    /* we need to pack data if the local input buffer is reversed
       and we are sending more than one element */
    if (rev && (size > stride))
        {
        offset = 0;
        /*#pragma omp ... */
        int i;
        for (i = 0; i <p; ++i)
            {
            int destproc = 0;
            int k;
            if (row_m)
                {
                for (k = ndim-1; k >=0 ;--k)
                    {
                    destproc *= pdim[k];
                    destproc += ((current_dim == k) ? i : pidx[k]);
                    }
                }
            else
                {
                for (k = 0; k < ndim; ++k)
                    {
                    destproc *= pdim[k];
                    destproc += ((current_dim == k) ? i : pidx[k]);
                    }
                }

            int rank = proc_map[destproc];

            int j1_offset = dfft_offset_send[rank]/sizeof(cpx_t)/stride;

            /* we are sending from a tmp buffer/stride */
            dfft_offset_send[rank] = offset*sizeof(cpx_t)*stride;
            int n = dfft_nsend[rank]/stride/sizeof(cpx_t);
            int j;
            for (j = 0; j < n; j++)
                for (k = 0; k < stride; ++ k)
                    scratch[(offset+j)*stride+k] = work[(j1_offset+j*c0)*stride+k];

            offset += n;
            }

        /* perform communication */
        MPI_Barrier(comm);
        MPI_Alltoallv(scratch,dfft_nsend, dfft_offset_send, MPI_BYTE,
                      work, dfft_nrecv, dfft_offset_recv, MPI_BYTE,
                      comm);
        }
    else
        {
        /* perform communication */
        MPI_Barrier(comm);
        MPI_Alltoallv(work,dfft_nsend, dfft_offset_send, MPI_BYTE,
                      scratch, dfft_nrecv, dfft_offset_recv, MPI_BYTE,
                      comm);

        /* unpack */
        int r;
        #pragma omp parallel for private(r)
        for (r = 0; r < npackets; ++r)
            {
            int j1, j1_offset, del;
            int j0_remote = j0_new_local + r*c1;
            if (rev && (length >= c0))
                {
                j1_offset = j0_remote*length/c0;
                del = 1;
                }
            else
                {
                j1_offset = j0_remote/c1;
                del = c0/c1;
                }
            int j;
            for (j = 0; j < (size/stride); ++j)
                {
                j1 = j1_offset + j*del;
                int k;
                for (k = 0; k < stride; ++k)
                    work[j1*stride+k] = scratch[r*size+j*stride+k];
                }
            }
        }
    }